

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpconvert.cpp
# Opt level: O1

void __thiscall LpConvert::run(LpConvert *this)

{
  string *psVar1;
  string *psVar2;
  AspifTextOutput *this_00;
  size_t __n;
  char cVar3;
  int iVar4;
  ErrorHandler err;
  Potassco *in;
  uint line;
  AspifTextOutput *pAVar5;
  ostream *os;
  SmodelsConvert smodels;
  SmodelsOutput writer;
  AspifTextOutput text;
  ofstream oFile;
  ifstream iFile;
  char *local_4b8;
  char *local_4b0;
  undefined1 local_4a8 [32];
  undefined1 local_488 [80];
  long local_438;
  filebuf local_430 [240];
  ios_base local_340 [264];
  Potassco local_238 [520];
  
  in = local_238;
  std::ifstream::ifstream(in);
  os = (ostream *)&local_438;
  std::ofstream::ofstream(os);
  psVar1 = &this->input_;
  if ((this->input_)._M_string_length != 0) {
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::ifstream::open((char *)local_238,(_Ios_Openmode)(psVar1->_M_dataplus)._M_p);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        local_4b0 = "Could not open input file!";
        local_4b8 = "iFile.is_open()";
        line = 0x5b;
        goto LAB_0010714e;
      }
    }
  }
  if ((this->output_)._M_string_length != 0) {
    psVar2 = &this->output_;
    iVar4 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar4 == 0) goto LAB_00106f4d;
    __n = (this->input_)._M_string_length;
    if (__n == (this->output_)._M_string_length) {
      local_4b0 = "Input and output must be different!";
      local_4b8 = "input_ != output_";
      line = 0x5e;
      if (__n == 0) goto LAB_0010714e;
      iVar4 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,__n);
      if (iVar4 == 0) goto LAB_0010714e;
    }
    std::ofstream::open((char *)&local_438,(_Ios_Openmode)(psVar2->_M_dataplus)._M_p);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      local_4b0 = "Could not open output file!";
      local_4b8 = "oFile.is_open()";
      line = 0x60;
LAB_0010714e:
      Potassco::fail(-3,"virtual void LpConvert::run()",line,local_4b8,local_4b0,0);
    }
  }
LAB_00106f4d:
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    in = (Potassco *)&std::cin;
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    os = (ostream *)&std::cout;
  }
  this_00 = (AspifTextOutput *)(local_488 + 0x20);
  Potassco::AspifTextOutput::AspifTextOutput(this_00,os);
  iVar4 = std::istream::peek();
  if (iVar4 != 0x61) {
    iVar4 = std::istream::peek();
    if (9 < iVar4 - 0x30U) {
      Potassco::fail(-3,"virtual void LpConvert::run()",0x65,
                     "in.peek() == \'a\' || std::isdigit(in.peek())","Unrecognized input format!",0)
      ;
    }
  }
  iVar4 = std::istream::peek();
  if (iVar4 == 0x61) {
    err = (ErrorHandler)0x0;
    Potassco::SmodelsOutput::SmodelsOutput((SmodelsOutput *)local_488,os,this->potassco_,0);
    Potassco::SmodelsConvert::SmodelsConvert
              ((SmodelsConvert *)local_4a8,(AbstractProgram *)local_488,this->potassco_);
    pAVar5 = (AspifTextOutput *)local_4a8;
    if (this->text_ != false) {
      pAVar5 = this_00;
    }
    Potassco::readAspif(in,(istream *)pAVar5,(AbstractProgram *)error,err);
    Potassco::SmodelsConvert::~SmodelsConvert((SmodelsConvert *)local_4a8);
  }
  else {
    Potassco::AspifOutput::AspifOutput((AspifOutput *)local_488,os);
    local_4a8[0] = false;
    local_4a8[1] = false;
    local_4a8[2] = false;
    local_4a8[3] = false;
    if (this->potassco_ == true) {
      local_4a8[0] = true;
      local_4a8[1] = true;
      local_4a8[2] = true;
      local_4a8[3] = false;
      if (this->filter_ == true) {
        local_4a8[0] = true;
        local_4a8[1] = true;
        local_4a8[2] = true;
        local_4a8[3] = true;
      }
    }
    pAVar5 = (AspifTextOutput *)local_488;
    if (this->text_ != false) {
      pAVar5 = this_00;
    }
    Potassco::readSmodels((istream *)in,&pAVar5->super_AbstractProgram,error,(Options *)local_4a8);
  }
  Potassco::AbstractProgram::~AbstractProgram((AbstractProgram *)local_488);
  std::ifstream::close();
  std::ofstream::close();
  Potassco::AspifTextOutput::~AspifTextOutput((AspifTextOutput *)(local_488 + 0x20));
  local_438 = _VTT;
  *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_430);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void LpConvert::run() {
	std::ifstream iFile;
	std::ofstream oFile;
	if (!input_.empty() && input_ != "-") {
		iFile.open(input_.c_str());
		POTASSCO_EXPECT(iFile.is_open(), "Could not open input file!");
	}
	if (!output_.empty() && output_ != "-") {
		POTASSCO_EXPECT(input_ != output_, "Input and output must be different!");
		oFile.open(output_.c_str());
		POTASSCO_EXPECT(oFile.is_open(), "Could not open output file!");
	}
	std::istream& in = iFile.is_open() ? iFile : std::cin;
	std::ostream& os = oFile.is_open() ? oFile : std::cout;
	Potassco::AspifTextOutput text(os);
	POTASSCO_EXPECT(in.peek() == 'a' || std::isdigit(in.peek()), "Unrecognized input format!");
	if (in.peek() == 'a') {
		Potassco::SmodelsOutput  writer(os, potassco_, 0);
		Potassco::SmodelsConvert smodels(writer, potassco_);
		Potassco::readAspif(in, !text_ ? static_cast<Potassco::AbstractProgram&>(smodels) : text, &error);
	}
	else {
		Potassco::AspifOutput aspif(os);
		Potassco::SmodelsInput::Options opts;
		if (potassco_) {
			opts.enableClaspExt().convertEdges().convertHeuristic();
			if (filter_) { opts.dropConverted(); }
		}
		Potassco::readSmodels(in, !text_? static_cast<Potassco::AbstractProgram&>(aspif) : text, &error, opts);
	}
	iFile.close();
	oFile.close();
}